

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perfect.hpp
# Opt level: O3

void __thiscall
Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>::Perfect
          (Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *this,FuncTerm *elem)

{
  PolyNf *pPVar1;
  TermList *pTVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  FuncTerm *this_00;
  uint uVar6;
  FuncTerm *local_58;
  Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> local_50;
  FuncTerm *local_40;
  uint *local_38;
  
  local_40 = elem;
  Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  ::tryGet((Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
            *)&local_38,(FuncTerm **)Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>::_ids);
  uVar6 = Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>::_ids._4_4_;
  if (local_38 == (uint *)0x0) {
    this_00 = (FuncTerm *)
              FixedSizeAllocator<48UL>::alloc
                        ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    uVar3 = *(undefined4 *)&(elem->_fun).field_0x4;
    pTVar2 = (elem->_fun)._typeArgs;
    (this_00->_fun)._num = (elem->_fun)._num;
    *(undefined4 *)&(this_00->_fun).field_0x4 = uVar3;
    (this_00->_fun)._typeArgs = pTVar2;
    (this_00->_args)._capacity = 0;
    (this_00->_args)._stack = (PolyNf *)0x0;
    (this_00->_args)._cursor = (PolyNf *)0x0;
    (this_00->_args)._end = (PolyNf *)0x0;
    (this_00->_args)._capacity = (elem->_args)._capacity;
    (elem->_args)._capacity = 0;
    (this_00->_args)._cursor = (elem->_args)._cursor;
    (elem->_args)._cursor = (PolyNf *)0x0;
    pPVar1 = (this_00->_args)._end;
    (this_00->_args)._end = (elem->_args)._end;
    (elem->_args)._end = pPVar1;
    pPVar1 = (this_00->_args)._stack;
    (this_00->_args)._stack = (elem->_args)._stack;
    (elem->_args)._stack = pPVar1;
    local_50._id = uVar6;
    local_58 = this_00;
    local_50._ptr = this_00;
    if ((int)Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>::_ids._24_4_ <=
        (int)Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>::_ids._4_4_) {
      Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
      ::expand((Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
                *)Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>::_ids);
    }
    uVar4 = Kernel::FuncId::defaultHash((FuncId *)this_00);
    uVar5 = StackHash<Lib::StlHash>::hash<Kernel::PolyNf>(&this_00->_args,0x811c9dc5);
    uVar4 = uVar4 * 0x40 + uVar5 + (uVar4 >> 2) + 0x9e3779b9 ^ uVar4;
    Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
    ::insert((Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
              *)Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>::_ids,&local_58,&local_50,
             uVar4 + (uVar4 == 0));
  }
  else {
    uVar6 = *local_38;
    this_00 = *(FuncTerm **)(local_38 + 2);
  }
  this->_id = uVar6;
  this->_ptr = this_00;
  return;
}

Assistant:

explicit Perfect(T elem) 
    : Perfect(_ids.tryGet(&elem).toOwned()
        .unwrapOrElse([&](){
            auto entry = Perfect(_ids.size(),  new T(std::move(elem)));
            _ids.insert(entry._ptr, entry);
            DEBUG(*elemPtr, " -> ", T::className(),"#",entry._id);
            return entry;
          })) 
    { }